

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O0

Http * __thiscall arbiter::Endpoint::getHttpDriver(Endpoint *this)

{
  ArbiterError *this_00;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Http *local_18;
  Http *d;
  Endpoint *this_local;
  
  d = (Http *)this;
  local_18 = tryGetHttpDriver(this);
  if (local_18 != (Http *)0x0) {
    return local_18;
  }
  this_00 = (ArbiterError *)__cxa_allocate_exception(0x10);
  profiledProtocol_abi_cxx11_(&local_78,this);
  ::std::operator+(&local_58,"Cannot get driver of type ",&local_78);
  ::std::operator+(&local_38,&local_58," as HTTP");
  ArbiterError::ArbiterError(this_00,&local_38);
  __cxa_throw(this_00,&ArbiterError::typeinfo,ArbiterError::~ArbiterError);
}

Assistant:

const drivers::Http& Endpoint::getHttpDriver() const
{
    if (auto d = tryGetHttpDriver()) return *d;
    else throw ArbiterError(
        "Cannot get driver of type " + profiledProtocol() + " as HTTP");
}